

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O3

pair<bool,_bool> __thiscall
hanabi_learning_env::HanabiState::AddToFireworks(HanabiState *this,HanabiCard card)

{
  HanabiGame *pHVar1;
  pointer piVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  
  uVar6 = card.color_;
  if (((int)uVar6 < 0) || (pHVar1 = this->parent_game_, pHVar1->num_colors_ <= (int)uVar6)) {
LAB_00115f3c:
    if (this->life_tokens_ < 1) {
      __assert_fail("life_tokens_ > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_state.cc"
                    ,0x80,"void hanabi_learning_env::HanabiState::DecrementLifeTokens()");
    }
    this->life_tokens_ = this->life_tokens_ + -1;
    uVar4 = 0;
  }
  else {
    piVar2 = (this->fireworks_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar2[uVar6 & 0x7fffffff] != card.rank_) goto LAB_00115f3c;
    iVar5 = card.rank_ + 1;
    piVar2[uVar6 & 0x7fffffff] = iVar5;
    uVar3 = 1;
    uVar4 = 1;
    if ((iVar5 == pHVar1->num_ranks_) &&
       (this->information_tokens_ < pHVar1->max_information_tokens_)) {
      this->information_tokens_ = this->information_tokens_ + 1;
      uVar4 = 0x100;
      goto LAB_00115f4c;
    }
  }
  uVar3 = uVar4;
  uVar4 = 0;
LAB_00115f4c:
  return (pair<bool,_bool>)(uVar4 | uVar3);
}

Assistant:

bool HanabiState::CardPlayableOnFireworks(int color, int rank) const {
  if (color < 0 || color >= ParentGame()->NumColors()) {
    return false;
  }
  return rank == fireworks_[color];
}